

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O3

Test * BuildTokenTestCompleteThreeStepsParallel::Create(void)

{
  BuildTest *this;
  
  this = (BuildTest *)operator_new(0x510);
  BuildTest::BuildTest(this);
  this[1].super_StateTestWithBuiltinRules.super_Test._vptr_Test =
       (_func_int **)&PTR__FakeTokenCommandRunner_001f74d0;
  *(undefined8 *)&this[1].super_StateTestWithBuiltinRules.state_.pools_._M_t._M_impl = 0;
  this[1].super_StateTestWithBuiltinRules.state_.pools_._M_t._M_impl.super__Rb_tree_header._M_header
  ._M_color = _S_red;
  this[1].super_StateTestWithBuiltinRules.state_.pools_._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  *(undefined4 *)
   &this[1].super_StateTestWithBuiltinRules.state_.edges_.
    super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.super__Vector_impl_data._M_start = 0
  ;
  *(undefined8 *)&this[1].super_StateTestWithBuiltinRules.state_.bindings_.bindings_._M_t._M_impl =
       0;
  this[1].super_StateTestWithBuiltinRules.state_.bindings_.bindings_._M_t._M_impl.
  super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&this[1].super_StateTestWithBuiltinRules.state_.bindings_.bindings_._M_t._M_impl.
           super__Rb_tree_header + 8) = (_Base_ptr)0x0;
  this[1].super_StateTestWithBuiltinRules.super_Test.failed_ = false;
  *(undefined3 *)&this[1].super_StateTestWithBuiltinRules.super_Test.field_0x9 = 0;
  this[1].super_StateTestWithBuiltinRules.super_Test.assertion_failures_ = 0;
  this[1].super_StateTestWithBuiltinRules.state_.paths_._M_h._M_buckets = (__buckets_ptr)0x0;
  this[1].super_StateTestWithBuiltinRules.state_.paths_._M_h._M_bucket_count = 0;
  this[1].super_StateTestWithBuiltinRules.state_.paths_._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  this[1].super_StateTestWithBuiltinRules.state_.paths_._M_h._M_element_count = 0;
  *(undefined8 *)&this[1].super_StateTestWithBuiltinRules.state_.paths_._M_h._M_rehash_policy = 0;
  *(undefined8 *)
   &this[1].super_StateTestWithBuiltinRules.state_.paths_._M_h._M_rehash_policy.field_0x4 = 0;
  *(undefined8 *)
   ((long)&this[1].super_StateTestWithBuiltinRules.state_.paths_._M_h._M_rehash_policy.
           _M_next_resize + 4) = 0;
  *(_Base_ptr *)
   ((long)&this[1].super_StateTestWithBuiltinRules.state_.pools_._M_t._M_impl.super__Rb_tree_header.
           _M_header + 8) = (_Base_ptr)0x0;
  *(_Base_ptr *)
   ((long)&this[1].super_StateTestWithBuiltinRules.state_.pools_._M_t._M_impl.super__Rb_tree_header.
           _M_header + 0x10) = (_Base_ptr)0x0;
  *(undefined4 *)
   ((long)&this[1].super_StateTestWithBuiltinRules.state_.pools_._M_t._M_impl.super__Rb_tree_header.
           _M_header + 0x18) = 0;
  this[1].super_StateTestWithBuiltinRules.state_.edges_.
  super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  this[1].super_StateTestWithBuiltinRules.state_.edges_.
  super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  *(undefined4 *)&this[1].super_StateTestWithBuiltinRules.state_.bindings_.super_Env._vptr_Env = 0;
  (this->super_StateTestWithBuiltinRules).super_Test._vptr_Test =
       (_func_int **)&PTR__BuildTokenTest_001f7928;
  (this->super_BuildLogUser)._vptr_BuildLogUser = (_func_int **)&DAT_001f7968;
  g_current_test = (Test *)this;
  return (Test *)this;
}

Assistant:

TEST_F(BuildTokenTest, CompleteThreeStepsParallel) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule token-available\n"
"  command = cat $in > $out\n"
"build out1: token-available in1\n"
"build out2: token-available in2\n"
"build out12: cat out1 out2\n"));

  // plan should execute more than one command
  string err;
  EXPECT_TRUE(builder_.AddTarget("out12", &err));
  ASSERT_EQ("", err);

  // allow running of all commands
  ExpectCanRunMore(4,     true, true,  true,  true);
  ExpectAcquireToken(4,   true, false, true,  true);
  // wait for commands to finalize
  ExpectWaitForCommand(4, true, false, false, false);

  EXPECT_TRUE(builder_.Build(&err));
  EXPECT_EQ("", err);

  EXPECT_EQ(3u, token_command_runner_.commands_ran_.size());
  EXPECT_TRUE((token_command_runner_.commands_ran_[0] == "cat in1 > out1" &&
               token_command_runner_.commands_ran_[1] == "cat in2 > out2") ||
              (token_command_runner_.commands_ran_[0] == "cat in2 > out2" &&
               token_command_runner_.commands_ran_[1] == "cat in1 > out1"));
  EXPECT_TRUE(token_command_runner_.commands_ran_[2] == "cat out1 out2 > out12");
}